

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void * rw::ps2::destroyNativeRaster(void *object,int32 offset,int32 param_3)

{
  long lVar1;
  
  lVar1 = *(long *)((long)object + (long)nativeRasterOffset + 0x30);
  if (lVar1 != 0) {
    (*DAT_00149850)(*(undefined8 *)(lVar1 + -8));
  }
  return object;
}

Assistant:

static void*
destroyNativeRaster(void *object, int32 offset, int32)
{
	Ps2Raster *raster = GETPS2RASTEREXT(object);
	freealign(raster->data);
	return object;
}